

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetOutputName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmLocalGenerator *lg;
  bool bVar1;
  char *__s;
  reference prop;
  pointer this_01;
  ulong uVar2;
  cmake *this_02;
  string *psVar3;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<const_pair<basic_string<char>,_ArtifactType>,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  undefined1 local_2c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  undefined1 local_250 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_230 [8];
  cmGeneratorExpression ge;
  char *outNameProp;
  string *p;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string outName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string configUpper;
  undefined1 local_110 [8];
  string type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  undefined1 local_b8 [8];
  value_type entry;
  _Self local_58;
  iterator i;
  OutputNameKey key;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  key._36_4_ = artifact;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
  ::pair<cmStateEnums::ArtifactType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
              *)&i,config,(ArtifactType *)&key.field_0x24);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->OutputNameMap,
              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
               *)&i);
  entry.second.field_2._8_8_ =
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->OutputNameMap);
  bVar1 = std::operator==(&local_58,(_Self *)((long)&entry.second.field_2 + 8));
  if (bVar1) {
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_&,_const_char_(&)[1],_true>
              ((pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
                *)&i,(char (*) [1])0x792b40);
    _Var5 = std::
            map<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::__cxx11::string,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
            ::
            insert<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>&>
                      ((map<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::__cxx11::string,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
                        *)&this->OutputNameMap,
                       (pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b8);
    local_58._M_node = (_Base_ptr)_Var5.first._M_node;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&type.field_2 + 8));
    __s = GetOutputTargetType(this,key._36_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_110,__s,(allocator<char> *)(configUpper.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(configUpper.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::UpperCase((string *)local_138,config);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      std::operator+(&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "_OUTPUT_NAME_");
      std::operator+(&local_158,&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "_OUTPUT_NAME");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_1b8,"OUTPUT_NAME_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outName.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "_OUTPUT_NAME");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),(value_type *)((long)&outName.field_2 + 8));
      std::__cxx11::string::~string((string *)(outName.field_2._M_local_buf + 8));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (type.field_2._M_local_buf + 8),(char (*) [12])0x7639fe);
    std::__cxx11::string::string((string *)&__range2);
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&type.field_2 + 8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    p = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&p), bVar1) {
      prop = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
      ge.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)GetProperty(this,prop);
      if (ge.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)&__range2,
                   (char *)ge.Backtrace.TopEntry.
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      psVar3 = GetName_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)&__range2,(string *)psVar3);
    }
    cge._M_t.
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_230,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_250,(string *)local_230);
    this_01 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)local_250);
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_270);
    psVar3 = cmCompiledGeneratorExpression::Evaluate
                       (this_01,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_270);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_58);
    std::__cxx11::string::operator=((string *)&ppVar4->second,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_270);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_250);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_230);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&type.field_2 + 8));
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_b8);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_58);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      this_02 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      psVar3 = GetName_abi_cxx11_(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2c0 + 0x10),"Target \'",psVar3);
      std::operator+(&local_290,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2c0 + 0x10),"\' OUTPUT_NAME depends on itself.");
      GetBacktrace((cmGeneratorTarget *)local_2c0);
      cmake::IssueMessage(this_02,FATAL_ERROR,&local_290,(cmListFileBacktrace *)local_2c0);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2c0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)(local_2c0 + 0x10));
    }
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar4->second);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
           *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetOutputName(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Lookup/compute/cache the output name for this configuration.
  OutputNameKey key(config, artifact);
  cmGeneratorTarget::OutputNameMapType::iterator i =
    this->OutputNameMap.find(key);
  if (i == this->OutputNameMap.end()) {
    // Add empty name in map to detect potential recursion.
    OutputNameMapType::value_type entry(key, "");
    i = this->OutputNameMap.insert(entry).first;

    // Compute output name.
    std::vector<std::string> props;
    std::string type = this->GetOutputTargetType(artifact);
    std::string configUpper = cmSystemTools::UpperCase(config);
    if (!type.empty() && !configUpper.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME_<CONFIG>
      props.push_back(type + "_OUTPUT_NAME_" + configUpper);
    }
    if (!type.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME
      props.push_back(type + "_OUTPUT_NAME");
    }
    if (!configUpper.empty()) {
      // OUTPUT_NAME_<CONFIG>
      props.push_back("OUTPUT_NAME_" + configUpper);
      // <CONFIG>_OUTPUT_NAME
      props.push_back(configUpper + "_OUTPUT_NAME");
    }
    // OUTPUT_NAME
    props.emplace_back("OUTPUT_NAME");

    std::string outName;
    for (std::string const& p : props) {
      if (const char* outNameProp = this->GetProperty(p)) {
        outName = outNameProp;
        break;
      }
    }

    if (outName.empty()) {
      outName = this->GetName();
    }

    // Now evaluate genex and update the previously-prepared map entry.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outName);
    i->second = cge->Evaluate(this->LocalGenerator, config);
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_NAME depends on itself.",
      this->GetBacktrace());
  }
  return i->second;
}